

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormat::FieldByteSize
                 (FieldDescriptor *field,Message *message)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  MapFieldBase *this;
  Nonnull<const_char_*> pcVar6;
  bool bVar7;
  Reflection *this_00;
  ulong uVar8;
  Metadata MVar9;
  
  MVar9 = Message::GetMetadata(message);
  this_00 = MVar9.reflection;
  bVar1 = field->field_0x1;
  if ((((bVar1 & 8) != 0) &&
      ((field->containing_type_->options_->field_0)._impl_.message_set_wire_format_ == true)) &&
     (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10)) {
    bVar7 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar7) {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar7,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar6 != (Nonnull<const_char_*>)0x0) goto LAB_0031f76e;
    if ((field->field_0x1 & 0x20) == 0) {
      sVar5 = MessageSetItemByteSize(field,message);
      return sVar5;
    }
  }
  bVar1 = field->field_0x1;
  bVar7 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar7) {
    pcVar6 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar7,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar6 != (Nonnull<const_char_*>)0x0) {
    FieldByteSize();
LAB_0031f76e:
    FieldByteSize();
  }
  if ((field->field_0x1 & 0x20) == 0) {
    uVar8 = 1;
    if ((field->containing_type_->options_->field_0)._impl_.map_entry_ == false) {
      bVar7 = Reflection::HasField(this_00,message,field);
      uVar8 = (ulong)bVar7;
    }
    goto LAB_0031f6a3;
  }
  if (field->type_ == '\v') {
    bVar7 = FieldDescriptor::is_map_message_type(field);
    if (!bVar7) goto LAB_0031f692;
    this = Reflection::GetMapData(this_00,message,field);
    bVar7 = MapFieldBase::IsMapValid(this);
    if (!bVar7) goto LAB_0031f692;
    uVar4 = MapFieldBase::size(this);
  }
  else {
LAB_0031f692:
    uVar4 = Reflection::FieldSize(this_00,message,field);
  }
  uVar8 = (ulong)uVar4;
LAB_0031f6a3:
  sVar5 = FieldDataOnlyByteSize(field,message);
  bVar7 = FieldDescriptor::is_packed(field);
  if (bVar7) {
    if (sVar5 == 0) {
      sVar5 = 0;
    }
    else {
      uVar4 = field->number_ * 8 + 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = (iVar3 * 9 + 0x49U >> 6) + sVar5 + (ulong)(iVar2 * 9 + 0x49U >> 6);
    }
  }
  else {
    uVar4 = field->number_ * 8 + 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = ((ulong)(iVar2 * 9 + 0x49U >> 6) << (field->type_ == '\n')) * uVar8 + sVar5;
  }
  return sVar5;
}

Assistant:

size_t WireFormat::FieldByteSize(const FieldDescriptor* field,
                                 const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return MessageSetItemByteSize(field, message);
  }

  size_t count = 0;
  if (field->is_repeated()) {
    if (field->is_map()) {
      const MapFieldBase* map_field =
          message_reflection->GetMapData(message, field);
      if (map_field->IsMapValid()) {
        count = FromIntSize(map_field->size());
      } else {
        count = FromIntSize(message_reflection->FieldSize(message, field));
      }
    } else {
      count = FromIntSize(message_reflection->FieldSize(message, field));
    }
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  const size_t data_size = FieldDataOnlyByteSize(field, message);
  size_t our_size = data_size;
  if (field->is_packed()) {
    if (data_size > 0) {
      // Packed fields get serialized like a string, not their native type.
      // Technically this doesn't really matter; the size only changes if it's
      // a GROUP
      our_size += TagSize(field->number(), FieldDescriptor::TYPE_STRING);
      our_size += io::CodedOutputStream::VarintSize32(data_size);
    }
  } else {
    our_size += count * TagSize(field->number(), field->type());
  }
  return our_size;
}